

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* chaiscript::
  boxed_cast<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>&>
            (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pBVar5;
  undefined8 *puVar6;
  undefined1 local_68 [16];
  uint local_58;
  undefined4 uStack_54;
  pointer_____offset_0x10___ *local_50;
  pointer_____offset_0x10___ *local_48;
  undefined4 local_40;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_68._0_8_ =
         &bootstrap::standard_library::
          Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          ::typeinfo;
    local_68._8_8_ =
         &bootstrap::standard_library::
          Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          ::typeinfo;
    local_58 = 2;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_68);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::
                convertable_type<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>&>
                          ((t_conversions->m_conversions)._M_data), bVar4)) {
      if ((t_conversions != (Type_Conversions_State *)0x0) &&
         (bVar4 = Type_Conversions::
                  convertable_type<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>&>
                            ((t_conversions->m_conversions)._M_data), bVar4)) {
        local_50 = &bootstrap::standard_library::
                    Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ::typeinfo;
        local_48 = &bootstrap::standard_library::
                    Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ::typeinfo;
        local_40 = 2;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_68,(Type_Info *)(t_conversions->m_conversions)._M_data,
                   (Conversion_Saves *)&local_50,(Boxed_Value *)(t_conversions->m_saves)._M_data);
        pBVar5 = (Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)detail::verify_type<void>
                              ((Boxed_Value *)local_68,
                               (type_info *)
                               &bootstrap::standard_library::
                                Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                ::typeinfo,*(pointer_____offset_0x10___ *)(local_68._0_8_ + 0x20));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return pBVar5;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        return pBVar5;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar1 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58 = (peVar1->m_type_info).m_flags;
      uStack_54 = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
      ptVar2 = (peVar1->m_type_info).m_type_info;
      ptVar3 = (peVar1->m_type_info).m_bare_type_info;
      *puVar6 = &PTR__bad_cast_003d0858;
      local_68._0_4_ = SUB84(ptVar2,0);
      local_68._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
      local_68._8_4_ = SUB84(ptVar3,0);
      local_68._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      *(undefined4 *)(puVar6 + 1) = local_68._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_68._4_4_;
      *(undefined4 *)(puVar6 + 2) = local_68._8_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = local_68._12_4_;
      puVar6[3] = _local_58;
      puVar6[4] = &bootstrap::standard_library::
                   Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   ::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_68._0_8_ = ptVar2;
      local_68._8_8_ = ptVar3;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  pBVar5 = (Bidir_Range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)detail::verify_type<void>
                        (bv,(type_info *)
                            &bootstrap::standard_library::
                             Bidir_Range<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             ::typeinfo,
                         ((bv->m_data).
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->m_data_ptr);
  return pBVar5;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }